

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O3

Path * FileSystemUtils::operator/(Path *__return_storage_ptr__,Path *lhs_,Path *rhs_)

{
  ulong uVar1;
  long *plVar2;
  long *plVar3;
  size_type sVar4;
  pointer pcVar5;
  __string_type __str;
  string strlhs;
  long *local_88;
  ulong local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  sVar4 = (lhs_->m_string)._M_string_length;
  if (sVar4 == 0) {
    __return_storage_ptr__->_vptr_Path = (_func_int **)&PTR__Path_00119a10;
    (__return_storage_ptr__->m_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_string).field_2;
    pcVar5 = (rhs_->m_string)._M_dataplus._M_p;
    sVar4 = (rhs_->m_string)._M_string_length;
  }
  else {
    if ((rhs_->m_string)._M_string_length != 0) {
      pcVar5 = (lhs_->m_string)._M_dataplus._M_p;
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar5,pcVar5 + sVar4);
      while (local_60 != 0) {
        uVar1 = std::__cxx11::string::find_last_of((char *)&local_68,0x1140b3,0xffffffffffffffff);
        if (uVar1 != local_60 - 1U) goto LAB_0010a329;
        std::__cxx11::string::erase((ulong)&local_68,uVar1);
      }
      local_60 = 0;
LAB_0010a329:
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_68,local_60 + (long)local_68);
      std::__cxx11::string::_M_replace_aux((ulong)&local_88,local_80,0,'\x01');
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_88,(ulong)(rhs_->m_string)._M_dataplus._M_p);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_38 = *plVar3;
        uStack_30 = (undefined4)plVar2[3];
        uStack_2c = *(undefined4 *)((long)plVar2 + 0x1c);
        local_48 = &local_38;
      }
      else {
        local_38 = *plVar3;
        local_48 = (long *)*plVar2;
      }
      local_40 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      __return_storage_ptr__->_vptr_Path = (_func_int **)&PTR__Path_00119a10;
      (__return_storage_ptr__->m_string)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_string).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_string,local_48,local_40 + (long)local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48,local_38 + 1);
      }
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
      if (local_68 == local_58) {
        return __return_storage_ptr__;
      }
      operator_delete(local_68,local_58[0] + 1);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->_vptr_Path = (_func_int **)&PTR__Path_00119a10;
    (__return_storage_ptr__->m_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_string).field_2;
    pcVar5 = (lhs_->m_string)._M_dataplus._M_p;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_string,pcVar5,pcVar5 + sVar4);
  return __return_storage_ptr__;
}

Assistant:

inline Path operator/( const Path& lhs_, const Path& rhs_ )
    {
        if( 0 == lhs_.m_string.length() )
        {
            return rhs_;
        }
        if( 0 == rhs_.m_string.length() )
        {
            return lhs_;
        }
        std::string strlhs = lhs_.m_string;
        while( strlhs.length() && strlhs.find_last_of( FILESYSTEMUTILS_SEPERATORS ) == strlhs.length()-1 )
        {
        	strlhs.erase(strlhs.length()-1, 1);
        }
        
        //note: should probably remove preceding seperators to rhs_, but this has not as yet occured
        Path join = strlhs + Path::seperator + rhs_.m_string;
        return join;
    }